

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_flow(AMQP_VALUE value,FLOW_HANDLE *flow_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE local_70;
  fields properties;
  uint32_t local_60;
  _Bool echo;
  _Bool drain;
  uint32_t available;
  uint32_t link_credit;
  sequence_no delivery_count;
  handle handle;
  uint32_t outgoing_window;
  transfer_number next_outgoing_id;
  uint32_t incoming_window;
  transfer_number next_incoming_id;
  AMQP_VALUE item_value;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  FLOW_INSTANCE *flow_instance;
  FLOW_HANDLE *ppFStack_18;
  int result;
  FLOW_HANDLE *flow_handle_local;
  AMQP_VALUE value_local;
  
  ppFStack_18 = flow_handle;
  flow_handle_local = (FLOW_HANDLE *)value;
  list_value = (AMQP_VALUE)flow_create_internal();
  *ppFStack_18 = (FLOW_HANDLE)list_value;
  if (*ppFStack_18 == (FLOW_HANDLE)0x0) {
    flow_instance._4_4_ = 0x1561;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)flow_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      flow_destroy(*ppFStack_18);
      flow_instance._4_4_ = 0x1569;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,(uint32_t *)((long)&item_value + 4));
      if (iVar1 == 0) {
        if ((item_value._4_4_ != 0) &&
           (_incoming_window = amqpvalue_get_list_item(pAStack_30,0),
           _incoming_window != (AMQP_VALUE)0x0)) {
          AVar2 = amqpvalue_get_type(_incoming_window);
          if ((AVar2 != AMQP_TYPE_NULL) &&
             (iVar1 = amqpvalue_get_uint(_incoming_window,&next_outgoing_id), iVar1 != 0)) {
            amqpvalue_destroy(_incoming_window);
            flow_destroy(*ppFStack_18);
            return 0x158c;
          }
          amqpvalue_destroy(_incoming_window);
        }
        if (item_value._4_4_ < 2) {
          flow_instance._4_4_ = 0x15ba;
        }
        else {
          _incoming_window = amqpvalue_get_list_item(pAStack_30,1);
          if (_incoming_window == (AMQP_VALUE)0x0) {
            flow_destroy(*ppFStack_18);
            flow_instance._4_4_ = 0x159c;
          }
          else {
            AVar2 = amqpvalue_get_type(_incoming_window);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(_incoming_window);
              flow_destroy(*ppFStack_18);
              flow_instance._4_4_ = 0x15a6;
            }
            else {
              iVar1 = amqpvalue_get_uint(_incoming_window,&outgoing_window);
              if (iVar1 == 0) {
                amqpvalue_destroy(_incoming_window);
                if (item_value._4_4_ < 3) {
                  flow_instance._4_4_ = 0x15e3;
                }
                else {
                  _incoming_window = amqpvalue_get_list_item(pAStack_30,2);
                  if (_incoming_window == (AMQP_VALUE)0x0) {
                    flow_destroy(*ppFStack_18);
                    flow_instance._4_4_ = 0x15c5;
                  }
                  else {
                    AVar2 = amqpvalue_get_type(_incoming_window);
                    if (AVar2 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(_incoming_window);
                      flow_destroy(*ppFStack_18);
                      flow_instance._4_4_ = 0x15cf;
                    }
                    else {
                      iVar1 = amqpvalue_get_uint(_incoming_window,&handle);
                      if (iVar1 == 0) {
                        amqpvalue_destroy(_incoming_window);
                        if (item_value._4_4_ < 4) {
                          flow_instance._4_4_ = 0x160c;
                        }
                        else {
                          _incoming_window = amqpvalue_get_list_item(pAStack_30,3);
                          if (_incoming_window == (AMQP_VALUE)0x0) {
                            flow_destroy(*ppFStack_18);
                            flow_instance._4_4_ = 0x15ee;
                          }
                          else {
                            AVar2 = amqpvalue_get_type(_incoming_window);
                            if (AVar2 == AMQP_TYPE_NULL) {
                              amqpvalue_destroy(_incoming_window);
                              flow_destroy(*ppFStack_18);
                              flow_instance._4_4_ = 0x15f8;
                            }
                            else {
                              iVar1 = amqpvalue_get_uint(_incoming_window,&delivery_count);
                              if (iVar1 == 0) {
                                amqpvalue_destroy(_incoming_window);
                                if ((4 < item_value._4_4_) &&
                                   (_incoming_window = amqpvalue_get_list_item(pAStack_30,4),
                                   _incoming_window != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_incoming_window);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_uint(_incoming_window,&link_credit),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_incoming_window);
                                    flow_destroy(*ppFStack_18);
                                    return 0x1624;
                                  }
                                  amqpvalue_destroy(_incoming_window);
                                }
                                if ((5 < item_value._4_4_) &&
                                   (_incoming_window = amqpvalue_get_list_item(pAStack_30,5),
                                   _incoming_window != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_incoming_window);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_uint(_incoming_window,&available),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_incoming_window);
                                    flow_destroy(*ppFStack_18);
                                    return 0x1641;
                                  }
                                  amqpvalue_destroy(_incoming_window);
                                }
                                if ((6 < item_value._4_4_) &&
                                   (_incoming_window = amqpvalue_get_list_item(pAStack_30,6),
                                   _incoming_window != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_incoming_window);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_uint(_incoming_window,
                                                                 (uint32_t *)
                                                                 &stack0xffffffffffffffa4),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_incoming_window);
                                    flow_destroy(*ppFStack_18);
                                    return 0x165e;
                                  }
                                  amqpvalue_destroy(_incoming_window);
                                }
                                if ((7 < item_value._4_4_) &&
                                   (_incoming_window = amqpvalue_get_list_item(pAStack_30,7),
                                   _incoming_window != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_incoming_window);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_uint(_incoming_window,&local_60),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_incoming_window);
                                    flow_destroy(*ppFStack_18);
                                    return 0x167b;
                                  }
                                  amqpvalue_destroy(_incoming_window);
                                }
                                if ((8 < item_value._4_4_) &&
                                   (_incoming_window = amqpvalue_get_list_item(pAStack_30,8),
                                   _incoming_window != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_incoming_window);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_boolean
                                                        (_incoming_window,
                                                         (_Bool *)((long)&properties + 7)),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_incoming_window);
                                    flow_destroy(*ppFStack_18);
                                    return 0x1698;
                                  }
                                  amqpvalue_destroy(_incoming_window);
                                }
                                if ((9 < item_value._4_4_) &&
                                   (_incoming_window = amqpvalue_get_list_item(pAStack_30,9),
                                   _incoming_window != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_incoming_window);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_boolean
                                                        (_incoming_window,
                                                         (_Bool *)((long)&properties + 6)),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_incoming_window);
                                    flow_destroy(*ppFStack_18);
                                    return 0x16b5;
                                  }
                                  amqpvalue_destroy(_incoming_window);
                                }
                                if ((10 < item_value._4_4_) &&
                                   (_incoming_window = amqpvalue_get_list_item(pAStack_30,10),
                                   _incoming_window != (AMQP_VALUE)0x0)) {
                                  AVar2 = amqpvalue_get_type(_incoming_window);
                                  if ((AVar2 != AMQP_TYPE_NULL) &&
                                     (iVar1 = amqpvalue_get_map(_incoming_window,&local_70),
                                     iVar1 != 0)) {
                                    amqpvalue_destroy(_incoming_window);
                                    flow_destroy(*ppFStack_18);
                                    return 0x16d2;
                                  }
                                  amqpvalue_destroy(_incoming_window);
                                }
                                pAVar3 = amqpvalue_clone((AMQP_VALUE)flow_handle_local);
                                *(AMQP_VALUE *)list_value = pAVar3;
                                flow_instance._4_4_ = 0;
                              }
                              else {
                                amqpvalue_destroy(_incoming_window);
                                flow_destroy(*ppFStack_18);
                                flow_instance._4_4_ = 0x1602;
                              }
                            }
                          }
                        }
                      }
                      else {
                        amqpvalue_destroy(_incoming_window);
                        flow_destroy(*ppFStack_18);
                        flow_instance._4_4_ = 0x15d9;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(_incoming_window);
                flow_destroy(*ppFStack_18);
                flow_instance._4_4_ = 0x15b0;
              }
            }
          }
        }
      }
      else {
        flow_instance._4_4_ = 0x1570;
      }
    }
  }
  return flow_instance._4_4_;
}

Assistant:

int amqpvalue_get_flow(AMQP_VALUE value, FLOW_HANDLE* flow_handle)
{
    int result;
    FLOW_INSTANCE* flow_instance = (FLOW_INSTANCE*)flow_create_internal();
    *flow_handle = flow_instance;
    if (*flow_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            flow_destroy(*flow_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* next-incoming-id */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                transfer_number next_incoming_id;
                                if (amqpvalue_get_transfer_number(item_value, &next_incoming_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incoming-window */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t incoming_window;
                                if (amqpvalue_get_uint(item_value, &incoming_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* next-outgoing-id */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                transfer_number next_outgoing_id;
                                if (amqpvalue_get_transfer_number(item_value, &next_outgoing_id) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* outgoing-window */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            {
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                flow_destroy(*flow_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                uint32_t outgoing_window;
                                if (amqpvalue_get_uint(item_value, &outgoing_window) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* delivery-count */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sequence_no delivery_count;
                                if (amqpvalue_get_sequence_no(item_value, &delivery_count) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* link-credit */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t link_credit;
                                if (amqpvalue_get_uint(item_value, &link_credit) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* available */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint32_t available;
                                if (amqpvalue_get_uint(item_value, &available) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* drain */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool drain;
                                if (amqpvalue_get_boolean(item_value, &drain) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* echo */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool echo;
                                if (amqpvalue_get_boolean(item_value, &echo) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    flow_destroy(*flow_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    flow_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}